

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O1

Promise<void> __thiscall
capnp::_::TestInterfaceImpl::baz(TestInterfaceImpl *this,BazContext context)

{
  long *in_RDX;
  Own<kj::_::ImmediatePromiseNode<kj::_::Void>_> OVar1;
  Promise<void> PVar2;
  Reader params;
  StructReader in_stack_000003f0;
  long *local_200;
  StructReader local_1f8;
  Runnable local_1c8;
  CapTableReader *pCStack_1c0;
  WirePointer *local_1b8;
  ArrayDisposer *pAStack_1b0;
  StructReader local_1a8;
  Maybe<kj::Exception> local_178;
  
  *(int *)context.hook[1]._vptr_CallContextHook = *(int *)context.hook[1]._vptr_CallContextHook + 1;
  local_200 = in_RDX;
  (**(code **)*in_RDX)(&local_1c8);
  local_178.ptr.field_1.value.ownFile.content.size_ = (size_t)local_1b8;
  local_178.ptr.field_1.value.ownFile.content.disposer = pAStack_1b0;
  local_178.ptr._0_8_ = local_1c8._vptr_Runnable;
  local_178.ptr.field_1.value.ownFile.content.ptr = (char *)pCStack_1c0;
  PointerReader::getStruct(&local_1f8,(PointerReader *)&local_178,(word *)0x0);
  if (local_1f8.pointerCount == 0) {
    local_1f8.nestingLimit = 0x7fffffff;
    local_1f8.pointers = (WirePointer *)0x0;
    local_1f8.segment = (SegmentReader *)0x0;
    local_1f8.capTable = (CapTableReader *)0x0;
  }
  local_178.ptr.field_1._16_4_ = local_1f8.nestingLimit;
  local_178.ptr._0_8_ = local_1f8.segment;
  local_178.ptr.field_1.value.ownFile.content.ptr = (char *)local_1f8.capTable;
  local_178.ptr.field_1.value.ownFile.content.size_ = (size_t)local_1f8.pointers;
  PointerReader::getStruct(&local_1a8,(PointerReader *)&local_178,(word *)0x0);
  anon_unknown_129::genericCheckTestMessage<capnproto_test::capnp::test::TestAllTypes::Reader>
            ((Reader)in_stack_000003f0);
  (**(code **)(*local_200 + 8))();
  local_1c8._vptr_Runnable = (_func_int **)&PTR_run_00635b98;
  pCStack_1c0 = (CapTableReader *)&local_200;
  kj::_::runCatchingExceptions(&local_178,&local_1c8);
  if ((Void)local_178.ptr.isSet == (Void)0x1) {
    kj::Exception::~Exception(&local_178.ptr.field_1.value);
  }
  else if (kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[88]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x388,ERROR,
               "\"failed: expected \" \"::kj::runCatchingExceptions([&]() { context.getParams(); }) != nullptr\""
               ,(char (*) [88])
                "failed: expected ::kj::runCatchingExceptions([&]() { context.getParams(); }) != nullptr"
              );
  }
  OVar1 = kj::heap<kj::_::ImmediatePromiseNode<kj::_::Void>,kj::_::Void>((Void *)&local_178);
  PVar2.super_PromiseBase.node.ptr = OVar1.ptr;
  (this->super_Server)._vptr_Server = (_func_int **)local_178.ptr._0_8_;
  *(char **)&(this->super_Server).field_0x8 = local_178.ptr.field_1.value.ownFile.content.ptr;
  PVar2.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar2.super_PromiseBase.node;
}

Assistant:

kj::Promise<void> TestInterfaceImpl::baz(BazContext context) {
  ++callCount;
  auto params = context.getParams();
  checkTestMessage(params.getS());
  context.releaseParams();
  EXPECT_ANY_THROW(context.getParams());

  return kj::READY_NOW;
}